

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O0

UBool __thiscall
icu_63::SimpleFormatter::applyPatternMinMaxArguments
          (SimpleFormatter *this,UnicodeString *pattern,int32_t min,int32_t max,
          UErrorCode *errorCode)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  char16_t *pcVar6;
  int iVar7;
  int local_54;
  int32_t argCount;
  int32_t argNumber;
  UChar c;
  int32_t i;
  int iStack_40;
  UBool inQuote;
  int32_t maxArg;
  int32_t textLength;
  int32_t patternLength;
  UChar *patternBuffer;
  UErrorCode *errorCode_local;
  int32_t max_local;
  int32_t min_local;
  UnicodeString *pattern_local;
  SimpleFormatter *this_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    pcVar6 = UnicodeString::getBuffer(pattern);
    iVar4 = UnicodeString::length(pattern);
    UnicodeString::setTo(&this->compiledPattern,L'\0');
    iStack_40 = 0;
    i = -1;
    bVar2 = false;
    argNumber = 0;
    while (argNumber < iVar4) {
      iVar7 = argNumber + 1;
      argCount._2_2_ = pcVar6[argNumber];
      if (argCount._2_2_ == L'\'') {
        if ((iVar7 < iVar4) && (argCount._2_2_ = pcVar6[iVar7], argCount._2_2_ == L'\'')) {
          iVar7 = argNumber + 2;
          goto LAB_0035dfdf;
        }
        if (!bVar2) {
          if ((argCount._2_2_ == L'{') || (argCount._2_2_ == L'}')) {
            bVar2 = true;
            iVar7 = argNumber + 2;
          }
          else {
            argCount._2_2_ = L'\'';
          }
          goto LAB_0035dfdf;
        }
        bVar2 = false;
        argNumber = iVar7;
      }
      else if ((bVar2) || (argCount._2_2_ != L'{')) {
LAB_0035dfdf:
        argNumber = iVar7;
        if (iStack_40 == 0) {
          UnicodeString::append(&this->compiledPattern,L'\xffff');
        }
        UnicodeString::append(&this->compiledPattern,argCount._2_2_);
        iStack_40 = iStack_40 + 1;
        if (iStack_40 == 0xfeff) {
          iStack_40 = 0;
        }
      }
      else {
        if (0 < iStack_40) {
          iVar5 = UnicodeString::length(&this->compiledPattern);
          UnicodeString::setCharAt
                    (&this->compiledPattern,(iVar5 - iStack_40) + -1,(short)iStack_40 + L'Ā');
          iStack_40 = 0;
        }
        if ((((argNumber + 2 < iVar4) && (local_54 = (ushort)pcVar6[iVar7] - 0x30, -1 < local_54))
            && (local_54 < 10)) && (pcVar6[argNumber + 2] == L'}')) {
          argNumber = argNumber + 3;
        }
        else {
          local_54 = -1;
          argCount._2_2_ = L'{';
          if (iVar7 < iVar4) {
            argNumber = argNumber + 2;
            argCount._2_2_ = pcVar6[iVar7];
            iVar7 = argNumber;
            if ((0x30 < (ushort)argCount._2_2_) && ((ushort)argCount._2_2_ < 0x3a)) {
              local_54 = (ushort)argCount._2_2_ - 0x30;
              do {
                bVar1 = false;
                if (argNumber < iVar4) {
                  iVar7 = argNumber + 1;
                  argCount._2_2_ = pcVar6[argNumber];
                  bVar1 = false;
                  argNumber = iVar7;
                  if (0x2f < (ushort)argCount._2_2_) {
                    bVar1 = (ushort)argCount._2_2_ < 0x3a;
                  }
                }
                iVar7 = argNumber;
              } while ((bVar1) &&
                      (local_54 = local_54 * 10 + ((ushort)argCount._2_2_ - 0x30), local_54 < 0x100)
                      );
            }
          }
          argNumber = iVar7;
          if ((local_54 < 0) || (argCount._2_2_ != L'}')) {
            *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return '\0';
          }
        }
        if (i < local_54) {
          i = local_54;
        }
        UnicodeString::append(&this->compiledPattern,(char16_t)local_54);
      }
    }
    if (0 < iStack_40) {
      iVar4 = UnicodeString::length(&this->compiledPattern);
      UnicodeString::setCharAt
                (&this->compiledPattern,(iVar4 - iStack_40) + -1,(short)iStack_40 + L'Ā');
    }
    iVar7 = i + 1;
    if ((iVar7 < min) || (max < iVar7)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._7_1_ = '\0';
    }
    else {
      UnicodeString::setCharAt(&this->compiledPattern,0,(UChar)iVar7);
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool SimpleFormatter::applyPatternMinMaxArguments(
        const UnicodeString &pattern,
        int32_t min, int32_t max,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return FALSE;
    }
    // Parse consistent with MessagePattern, but
    // - support only simple numbered arguments
    // - build a simple binary structure into the result string
    const UChar *patternBuffer = pattern.getBuffer();
    int32_t patternLength = pattern.length();
    // Reserve the first char for the number of arguments.
    compiledPattern.setTo((UChar)0);
    int32_t textLength = 0;
    int32_t maxArg = -1;
    UBool inQuote = FALSE;
    for (int32_t i = 0; i < patternLength;) {
        UChar c = patternBuffer[i++];
        if (c == APOS) {
            if (i < patternLength && (c = patternBuffer[i]) == APOS) {
                // double apostrophe, skip the second one
                ++i;
            } else if (inQuote) {
                // skip the quote-ending apostrophe
                inQuote = FALSE;
                continue;
            } else if (c == OPEN_BRACE || c == CLOSE_BRACE) {
                // Skip the quote-starting apostrophe, find the end of the quoted literal text.
                ++i;
                inQuote = TRUE;
            } else {
                // The apostrophe is part of literal text.
                c = APOS;
            }
        } else if (!inQuote && c == OPEN_BRACE) {
            if (textLength > 0) {
                compiledPattern.setCharAt(compiledPattern.length() - textLength - 1,
                                          (UChar)(ARG_NUM_LIMIT + textLength));
                textLength = 0;
            }
            int32_t argNumber;
            if ((i + 1) < patternLength &&
                    0 <= (argNumber = patternBuffer[i] - DIGIT_ZERO) && argNumber <= 9 &&
                    patternBuffer[i + 1] == CLOSE_BRACE) {
                i += 2;
            } else {
                // Multi-digit argument number (no leading zero) or syntax error.
                // MessagePattern permits PatternProps.skipWhiteSpace(pattern, index)
                // around the number, but this class does not.
                argNumber = -1;
                if (i < patternLength && DIGIT_ONE <= (c = patternBuffer[i++]) && c <= DIGIT_NINE) {
                    argNumber = c - DIGIT_ZERO;
                    while (i < patternLength &&
                            DIGIT_ZERO <= (c = patternBuffer[i++]) && c <= DIGIT_NINE) {
                        argNumber = argNumber * 10 + (c - DIGIT_ZERO);
                        if (argNumber >= ARG_NUM_LIMIT) {
                            break;
                        }
                    }
                }
                if (argNumber < 0 || c != CLOSE_BRACE) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return FALSE;
                }
            }
            if (argNumber > maxArg) {
                maxArg = argNumber;
            }
            compiledPattern.append((UChar)argNumber);
            continue;
        }  // else: c is part of literal text
        // Append c and track the literal-text segment length.
        if (textLength == 0) {
            // Reserve a char for the length of a new text segment, preset the maximum length.
            compiledPattern.append(SEGMENT_LENGTH_PLACEHOLDER_CHAR);
        }
        compiledPattern.append(c);
        if (++textLength == MAX_SEGMENT_LENGTH) {
            textLength = 0;
        }
    }
    if (textLength > 0) {
        compiledPattern.setCharAt(compiledPattern.length() - textLength - 1,
                                  (UChar)(ARG_NUM_LIMIT + textLength));
    }
    int32_t argCount = maxArg + 1;
    if (argCount < min || max < argCount) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }
    compiledPattern.setCharAt(0, (UChar)argCount);
    return TRUE;
}